

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O2

bool __thiscall
draco::GeometryAttribute::ConvertTypedValue<unsigned_long,int>
          (GeometryAttribute *this,AttributeValueIndex att_id,uint8_t out_num_components,
          int *out_value)

{
  DataBuffer *pDVar1;
  ulong uVar2;
  ulong *puVar3;
  byte bVar4;
  int i;
  ulong uVar5;
  
  pDVar1 = this->buffer_;
  puVar3 = (ulong *)((pDVar1->data_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start +
                    this->byte_offset_ + (ulong)att_id.value_ * this->byte_stride_);
  uVar2 = 0;
  while( true ) {
    bVar4 = this->num_components_;
    uVar5 = (ulong)bVar4;
    if (out_num_components <= bVar4) {
      bVar4 = out_num_components;
    }
    if (bVar4 <= uVar2) goto LAB_00116785;
    if (((pDVar1->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish <= puVar3) || (0x7fffffff < *puVar3)) break;
    out_value[uVar2] = (int)*puVar3;
    puVar3 = puVar3 + 1;
    uVar2 = uVar2 + 1;
  }
LAB_0011678a:
  return bVar4 <= uVar2;
LAB_00116785:
  for (; uVar5 < out_num_components; uVar5 = uVar5 + 1) {
    out_value[uVar5] = 0;
  }
  goto LAB_0011678a;
}

Assistant:

inline int64_t GetBytePos(AttributeValueIndex att_index) const {
    return byte_offset_ + byte_stride_ * att_index.value();
  }